

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::DefaultsTest::CheckIndexed64
          (DefaultsTest *this,GLenum pname,GLuint index,GLint64 expected)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  bool bVar4;
  Enum<int,_2UL> EVar5;
  Enum<int,_2UL> local_1d8 [2];
  MessageBuilder local_1b8;
  Functions *local_38;
  GLint64 result;
  Functions *gl;
  GLint64 expected_local;
  GLuint index_local;
  GLenum pname_local;
  DefaultsTest *this_local;
  
  gl = (Functions *)expected;
  expected_local._0_4_ = index;
  expected_local._4_4_ = pname;
  _index_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  result = CONCAT44(extraout_var,iVar1);
  local_38 = (Functions *)0x0;
  (**(code **)(result + 0xb78))(this->m_vao,(GLuint)expected_local,expected_local._4_4_,&local_38);
  err = (**(code **)(result + 0x800))();
  glu::checkError(err,"glGetVertexArrayIndexed64iv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xfff);
  bVar4 = local_38 == gl;
  if (!bVar4) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1b8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1b8,(char (*) [38])"Default Vertex Array Object at index ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(uint *)&expected_local);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [16])0x2a7f92a);
    EVar5 = glu::getVertexAttribParameterNameStr(expected_local._4_4_);
    local_1d8[0].m_getName = EVar5.m_getName;
    local_1d8[0].m_value = EVar5.m_value;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1d8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [11])0x2affa57);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(long *)&local_38);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [7])0x2a796ef);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(long *)&gl);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [27])0x2a84efa);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  }
  return bVar4;
}

Assistant:

bool DefaultsTest::CheckIndexed64(const glw::GLenum pname, const glw::GLuint index, const glw::GLint64 expected)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint64 result = 0;

	gl.getVertexArrayIndexed64iv(m_vao, index, pname, &result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetVertexArrayIndexed64iv call failed.");

	if (result != expected)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Default Vertex Array Object at index " << index
											<< " has parameter " << glu::getVertexAttribParameterNameStr(pname)
											<< " equal to " << result << ", but " << expected
											<< " was expected. Test fails." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}